

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O0

void t42_parse_encoding(T42_Face face,T42_Loader loader)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 uVar3;
  _func_void_PS_Table *p_Var4;
  FT_Pointer pvVar5;
  void *in_RCX;
  long extraout_RDX;
  void *P;
  uint local_6c;
  FT_UInt len;
  FT_Int charcode;
  char *notdef;
  FT_Bool only_immediates;
  FT_Memory pFStack_58;
  FT_Error error;
  FT_Memory memory;
  PS_Table char_table;
  FT_Int n;
  FT_Int count;
  T1_Encoding encode;
  PSAux_Service psaux;
  FT_Byte *limit;
  FT_Byte *cur;
  T42_Parser parser;
  T42_Loader loader_local;
  T42_Face face_local;
  
  psaux = (PSAux_Service)(loader->parser).root.limit;
  encode = (T1_Encoding)face->psaux;
  cur = (FT_Byte *)loader;
  parser = &loader->parser;
  loader_local = (T42_Loader)face;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  limit = *(FT_Byte **)cur;
  if (limit < psaux) {
    if ((*(byte *)&((PSAux_Service)limit)->ps_table_funcs - 0x30 < 10) ||
       (*(char *)&((PSAux_Service)limit)->ps_table_funcs == '[')) {
      _n = &(loader_local->swap_table).funcs.done;
      memory = (FT_Memory)&parser[1].root.base;
      pFStack_58 = *(FT_Memory *)(cur + 0x20);
      notdef._3_1_ = '\0';
      if (*(char *)&((PSAux_Service)limit)->ps_table_funcs == '[') {
        char_table._4_4_ = 0x100;
        notdef._3_1_ = '\x01';
        in_RCX = (void *)(*(long *)cur + 1);
        *(void **)cur = in_RCX;
      }
      else {
        char_table._4_4_ = (**(code **)(cur + 0x48))(cur);
      }
      if (char_table._4_4_ < 0x101) {
        (**(code **)(cur + 0x38))(cur);
        if (*(PSAux_Service *)cur < psaux) {
          if (_n[2] != (_func_void_PS_Table *)0x0) {
            ft_mem_free(pFStack_58,_n[2]);
            _n[2] = (_func_void_PS_Table *)0x0;
            P = _n[3];
            ft_mem_free(pFStack_58,P);
            *(int *)((long)(_n + 3) + 0) = 0;
            *(int *)((long)(_n + 3) + 4) = 0;
            if (memory[2].realloc != (FT_Realloc_Func)0x0) {
              (*memory[2].realloc)(memory,(long)P,extraout_RDX,in_RCX);
            }
          }
          *(int *)_n = char_table._4_4_;
          *(int *)&parser[1].root.cursor = char_table._4_4_;
          p_Var4 = (_func_void_PS_Table *)
                   ft_mem_realloc(pFStack_58,2,0,(long)char_table._4_4_,(void *)0x0,
                                  (FT_Error *)((long)&notdef + 4));
          _n[2] = p_Var4;
          if (notdef._4_4_ == 0) {
            pvVar5 = ft_mem_realloc(pFStack_58,8,0,(long)char_table._4_4_,(void *)0x0,
                                    (FT_Error *)((long)&notdef + 4));
            _n[3] = (_func_void_PS_Table *)pvVar5;
            if ((notdef._4_4_ == 0) &&
               (notdef._4_4_ = (*(code *)**(undefined8 **)encode)
                                         (memory,char_table._4_4_,pFStack_58), notdef._4_4_ == 0)) {
              notdef._4_4_ = 0;
              for (char_table._0_4_ = 0; (int)(uint)char_table < char_table._4_4_;
                  char_table._0_4_ = (uint)char_table + 1) {
                (*memory[2].free)(memory,(void *)(ulong)(uint)char_table);
              }
              char_table._0_4_ = 0;
              (**(code **)(cur + 0x38))(cur);
              do {
                if (psaux <= *(PSAux_Service *)cur) {
LAB_003538be:
                  *(undefined4 *)&(loader_local->swap_table).funcs.init = 1;
                  *(FT_Byte **)cur = limit;
                  return;
                }
                limit = *(FT_Byte **)cur;
                if ((((*limit == 'd') && ((PSAux_Service)(limit + 3) < psaux)) && (limit[1] == 'e'))
                   && ((limit[2] == 'f' && (iVar2 = t42_is_space(limit[3]), iVar2 != 0)))) {
                  limit = limit + 3;
                  goto LAB_003538be;
                }
                if (*limit == ']') {
                  limit = limit + 1;
                  goto LAB_003538be;
                }
                if ((*limit - 0x30 < 10) || (notdef._3_1_ != '\0')) {
                  if (notdef._3_1_ == '\0') {
                    local_6c = (**(code **)(cur + 0x48))(cur);
                    (**(code **)(cur + 0x38))(cur);
                    if (limit == *(FT_Byte **)cur) {
                      cur[0x18] = '\x02';
                      cur[0x19] = '\0';
                      cur[0x1a] = '\0';
                      cur[0x1b] = '\0';
                      return;
                    }
                  }
                  else {
                    local_6c = (uint)char_table;
                  }
                  limit = *(FT_Byte **)cur;
                  if ((((PSAux_Service)(limit + 2) < psaux) && (*limit == '/')) &&
                     ((int)(uint)char_table < char_table._4_4_)) {
                    limit = limit + 1;
                    *(FT_Byte **)cur = limit;
                    (**(code **)(cur + 0x40))(cur);
                    if (psaux <= *(PSAux_Service *)cur) {
                      return;
                    }
                    if (*(int *)(cur + 0x18) != 0) {
                      return;
                    }
                    uVar1 = *(undefined8 *)cur;
                    iVar2 = (int)limit;
                    uVar3 = (*memory[2].free)(memory,(void *)(ulong)local_6c);
                    *(undefined4 *)(cur + 0x18) = uVar3;
                    if (*(int *)(cur + 0x18) != 0) {
                      return;
                    }
                    *(undefined1 *)
                     (*(long *)(memory[1].alloc + (long)(int)local_6c * 8) +
                     (ulong)(uint)((int)uVar1 - iVar2)) = 0;
                    char_table._0_4_ = (uint)char_table + 1;
                  }
                  else if (notdef._3_1_ != '\0') {
                    cur[0x18] = '\x02';
                    cur[0x19] = '\0';
                    cur[0x1a] = '\0';
                    cur[0x1b] = '\0';
                    return;
                  }
                }
                else {
                  (**(code **)(cur + 0x40))(cur);
                  if (*(int *)(cur + 0x18) != 0) {
                    return;
                  }
                }
                (**(code **)(cur + 0x38))(cur);
              } while( true );
            }
          }
          *(int *)(cur + 0x18) = notdef._4_4_;
        }
      }
      else {
        cur[0x18] = '\x03';
        cur[0x19] = '\0';
        cur[0x1a] = '\0';
        cur[0x1b] = '\0';
      }
    }
    else if (((PSAux_Service)((long)&((PSAux_Service)limit)->t1_builder_funcs + 1U) < psaux) &&
            (iVar2 = strncmp((char *)limit,"StandardEncoding",0x10), iVar2 == 0)) {
      *(undefined4 *)&(loader_local->swap_table).funcs.init = 2;
    }
    else if (((PSAux_Service)(limit + 0xf) < psaux) &&
            (iVar2 = strncmp((char *)limit,"ExpertEncoding",0xe), iVar2 == 0)) {
      *(undefined4 *)&(loader_local->swap_table).funcs.init = 4;
    }
    else if (((PSAux_Service)(limit + 0x12) < psaux) &&
            (iVar2 = strncmp((char *)limit,"ISOLatin1Encoding",0x11), iVar2 == 0)) {
      *(undefined4 *)&(loader_local->swap_table).funcs.init = 3;
    }
    else {
      cur[0x18] = 0xa2;
      cur[0x19] = '\0';
      cur[0x1a] = '\0';
      cur[0x1b] = '\0';
    }
  }
  else {
    cur[0x18] = '\x03';
    cur[0x19] = '\0';
    cur[0x1a] = '\0';
    cur[0x1b] = '\0';
  }
  return;
}

Assistant:

static void
  t42_parse_encoding( T42_Face    face,
                      T42_Loader  loader )
  {
    T42_Parser  parser = &loader->parser;
    FT_Byte*    cur;
    FT_Byte*    limit  = parser->root.limit;

    PSAux_Service  psaux  = (PSAux_Service)face->psaux;


    T1_Skip_Spaces( parser );
    cur = parser->root.cursor;
    if ( cur >= limit )
    {
      FT_ERROR(( "t42_parse_encoding: out of bounds\n" ));
      parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    /* if we have a number or `[', the encoding is an array, */
    /* and we must load it now                               */
    if ( ft_isdigit( *cur ) || *cur == '[' )
    {
      T1_Encoding  encode          = &face->type1.encoding;
      FT_Int       count, n;
      PS_Table     char_table      = &loader->encoding_table;
      FT_Memory    memory          = parser->root.memory;
      FT_Error     error;
      FT_Bool      only_immediates = 0;


      /* read the number of entries in the encoding; should be 256 */
      if ( *cur == '[' )
      {
        count           = 256;
        only_immediates = 1;
        parser->root.cursor++;
      }
      else
        count = (FT_Int)T1_ToInt( parser );

      /* only composite fonts (which we don't support) */
      /* can have larger values                        */
      if ( count > 256 )
      {
        FT_ERROR(( "t42_parse_encoding: invalid encoding array size\n" ));
        parser->root.error = FT_THROW( Invalid_File_Format );
        return;
      }

      T1_Skip_Spaces( parser );
      if ( parser->root.cursor >= limit )
        return;

      /* PostScript happily allows overwriting of encoding arrays */
      if ( encode->char_index )
      {
        FT_FREE( encode->char_index );
        FT_FREE( encode->char_name );
        T1_Release_Table( char_table );
      }

      /* we use a T1_Table to store our charnames */
      loader->num_chars = encode->num_chars = count;
      if ( FT_NEW_ARRAY( encode->char_index, count )     ||
           FT_NEW_ARRAY( encode->char_name,  count )     ||
           FT_SET_ERROR( psaux->ps_table_funcs->init(
                           char_table, count, memory ) ) )
      {
        parser->root.error = error;
        return;
      }

      /* We need to `zero' out encoding_table.elements */
      for ( n = 0; n < count; n++ )
      {
        char*  notdef = (char *)".notdef";


        (void)T1_Add_Table( char_table, n, notdef, 8 );
      }

      /* Now we need to read records of the form                */
      /*                                                        */
      /*   ... charcode /charname ...                           */
      /*                                                        */
      /* for each entry in our table.                           */
      /*                                                        */
      /* We simply look for a number followed by an immediate   */
      /* name.  Note that this ignores correctly the sequence   */
      /* that is often seen in type42 fonts:                    */
      /*                                                        */
      /*   0 1 255 { 1 index exch /.notdef put } for dup        */
      /*                                                        */
      /* used to clean the encoding array before anything else. */
      /*                                                        */
      /* Alternatively, if the array is directly given as       */
      /*                                                        */
      /*   /Encoding [ ... ]                                    */
      /*                                                        */
      /* we only read immediates.                               */

      n = 0;
      T1_Skip_Spaces( parser );

      while ( parser->root.cursor < limit )
      {
        cur = parser->root.cursor;

        /* we stop when we encounter `def' or `]' */
        if ( *cur == 'd' && cur + 3 < limit )
        {
          if ( cur[1] == 'e'          &&
               cur[2] == 'f'          &&
               t42_is_space( cur[3] ) )
          {
            FT_TRACE6(( "encoding end\n" ));
            cur += 3;
            break;
          }
        }
        if ( *cur == ']' )
        {
          FT_TRACE6(( "encoding end\n" ));
          cur++;
          break;
        }

        /* check whether we have found an entry */
        if ( ft_isdigit( *cur ) || only_immediates )
        {
          FT_Int  charcode;


          if ( only_immediates )
            charcode = n;
          else
          {
            charcode = (FT_Int)T1_ToInt( parser );
            T1_Skip_Spaces( parser );

            /* protect against invalid charcode */
            if ( cur == parser->root.cursor )
            {
              parser->root.error = FT_THROW( Unknown_File_Format );
              return;
            }
          }

          cur = parser->root.cursor;

          if ( cur + 2 < limit && *cur == '/' && n < count )
          {
            FT_UInt  len;


            cur++;

            parser->root.cursor = cur;
            T1_Skip_PS_Token( parser );
            if ( parser->root.cursor >= limit )
              return;
            if ( parser->root.error )
              return;

            len = (FT_UInt)( parser->root.cursor - cur );

            parser->root.error = T1_Add_Table( char_table, charcode,
                                               cur, len + 1 );
            if ( parser->root.error )
              return;
            char_table->elements[charcode][len] = '\0';

            n++;
          }
          else if ( only_immediates )
          {
            /* Since the current position is not updated for           */
            /* immediates-only mode we would get an infinite loop if   */
            /* we don't do anything here.                              */
            /*                                                         */
            /* This encoding array is not valid according to the       */
            /* type42 specification (it might be an encoding for a CID */
            /* type42 font, however), so we conclude that this font is */
            /* NOT a type42 font.                                      */
            parser->root.error = FT_THROW( Unknown_File_Format );
            return;
          }
        }
        else
        {
          T1_Skip_PS_Token( parser );
          if ( parser->root.error )
            return;
        }

        T1_Skip_Spaces( parser );
      }

      face->type1.encoding_type = T1_ENCODING_TYPE_ARRAY;
      parser->root.cursor       = cur;
    }

    /* Otherwise, we should have either `StandardEncoding', */
    /* `ExpertEncoding', or `ISOLatin1Encoding'             */
    else
    {
      if ( cur + 17 < limit                                            &&
           ft_strncmp( (const char*)cur, "StandardEncoding", 16 ) == 0 )
        face->type1.encoding_type = T1_ENCODING_TYPE_STANDARD;

      else if ( cur + 15 < limit                                          &&
                ft_strncmp( (const char*)cur, "ExpertEncoding", 14 ) == 0 )
        face->type1.encoding_type = T1_ENCODING_TYPE_EXPERT;

      else if ( cur + 18 < limit                                             &&
                ft_strncmp( (const char*)cur, "ISOLatin1Encoding", 17 ) == 0 )
        face->type1.encoding_type = T1_ENCODING_TYPE_ISOLATIN1;

      else
        parser->root.error = FT_ERR( Ignore );
    }
  }